

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Cec_ManLSCorrespondenceBmc(Gia_Man_t *pAig,Cec_ParCor_t *pPars,int nPrefs)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  Gia_Man_t *pSim;
  int iVar3;
  Gia_Man_t *p;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  Gia_Man_t *p_00;
  Vec_Int_t **pvOutputs;
  int in_R9D;
  Vec_Str_t *vStatus;
  Vec_Int_t *vOutputs;
  timespec ts;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t ParsSim;
  Vec_Str_t *local_c8;
  Vec_Int_t *local_c0;
  int local_b4;
  Gia_Man_t *local_b0;
  Gia_Man_t *local_a8;
  timespec local_a0;
  ulong local_90;
  Cec_ParSat_t local_84;
  Cec_ParSim_t local_60;
  
  Cec_ManSimSetDefaultParams(&local_60);
  local_60.nWords = pPars->nWords;
  local_60.nFrames = pPars->nRounds;
  local_60.fVerbose = pPars->fVerbose;
  local_60.fLatchCorr = pPars->fLatchCorr;
  local_60.fSeqSimulate = 1;
  local_a8 = pAig;
  local_b0 = (Gia_Man_t *)Cec_ManSimStart(pAig,&local_60);
  Cec_ManSatSetDefaultParams(&local_84);
  local_84.nBTLimit = pPars->nBTLimit;
  local_84.fVerbose = pPars->fVerbose;
  local_b4 = nPrefs + 1;
  local_90 = (ulong)(uint)nPrefs;
  do {
    iVar3 = clock_gettime(3,&local_a0);
    if (iVar3 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_a0.tv_sec * -1000000;
    }
    pvOutputs = &local_c0;
    p = Gia_ManCorrSpecReduceInit
                  (local_a8,pPars->nFrames,(int)local_90,(uint)(pPars->fLatchCorr == 0),pvOutputs,
                   in_R9D);
    iVar3 = (int)pvOutputs;
    if (p->vCos->nSize == p->nRegs) {
      Gia_ManStop(p);
      if (local_c0->pArray != (int *)0x0) {
        free(local_c0->pArray);
      }
      free(local_c0);
      break;
    }
    local_84.nBTLimit = local_84.nBTLimit * 10;
    if (pPars->fUseCSat == 0) {
      pVVar4 = Cec_ManSatSolveMiter(p,&local_84,&local_c8);
    }
    else {
      pVVar4 = Tas_ManSolveMiterNc(p,pPars->nBTLimit,&local_c8,0);
    }
    pSim = local_b0;
    iVar1 = pVVar4->nSize;
    if (iVar1 != 0) {
      p_00 = local_b0;
      Cec_ManResimulateCounterExamples((Cec_ManSim_t *)local_b0,pVVar4,pPars->nFrames + local_b4);
      Gia_ManCheckRefinements(p_00,local_c8,local_c0,(Cec_ManSim_t *)pSim,iVar3);
    }
    pVVar2 = local_c8;
    if (pPars->fVerbose != 0) {
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
      Cec_ManRefinedClassPrintStats(local_a8,pVVar2,-1,lVar5 + lVar6);
    }
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
    pVVar2 = local_c8;
    if (local_c8->pArray != (char *)0x0) {
      free(local_c8->pArray);
    }
    free(pVVar2);
    Gia_ManStop(p);
    pVVar4 = local_c0;
    if (local_c0->pArray != (int *)0x0) {
      free(local_c0->pArray);
    }
    free(pVVar4);
  } while (iVar1 != 0);
  Cec_ManSimStop((Cec_ManSim_t *)local_b0);
  return;
}

Assistant:

void Cec_ManLSCorrespondenceBmc( Gia_Man_t * pAig, Cec_ParCor_t * pPars, int nPrefs )
{  
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int fChanges, RetValue;
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr = pPars->fLatchCorr;
    pParsSim->fSeqSimulate = 1;
    pSim = Cec_ManSimStart( pAig, pParsSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    fChanges = 1;
    while ( fChanges )
    {
        abctime clkBmc = Abc_Clock();
        fChanges = 0;
        pSrm = Gia_ManCorrSpecReduceInit( pAig, pPars->nFrames, nPrefs, !pPars->fLatchCorr, &vOutputs, pPars->fUseRings );
        if ( Gia_ManPoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            Vec_IntFree( vOutputs );
            break;
        } 
        pParsSat->nBTLimit *= 10;
        if ( pPars->fUseCSat )
            vCexStore = Tas_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        // refine classes with these counter-examples
        if ( Vec_IntSize(vCexStore) )
        {
            RetValue = Cec_ManResimulateCounterExamples( pSim, vCexStore, pPars->nFrames + 1 + nPrefs );
            Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
            fChanges = 1;
        }
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, -1, Abc_Clock() - clkBmc );
        // recycle
        Vec_IntFree( vCexStore );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        Vec_IntFree( vOutputs );
    }
    Cec_ManSimStop( pSim );
}